

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_complete16(void *zSql)

{
  uint uVar1;
  sqlite3_value *v;
  char *zSql_00;
  _func_void_void_ptr *in_R8;
  
  uVar1 = sqlite3_initialize();
  if (uVar1 == 0) {
    v = sqlite3ValueNew((sqlite3 *)0x0);
    sqlite3ValueSetStr(v,(int)zSql,(void *)0x2,'\0',in_R8);
    zSql_00 = (char *)sqlite3ValueText(v,'\x01');
    if (zSql_00 == (char *)0x0) {
      uVar1 = 7;
    }
    else {
      uVar1 = sqlite3_complete(zSql_00);
      uVar1 = uVar1 & 0xff;
    }
    sqlite3ValueFree(v);
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_complete16(const void *zSql){
  sqlite3_value *pVal;
  char const *zSql8;
  int rc;

#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  pVal = sqlite3ValueNew(0);
  sqlite3ValueSetStr(pVal, -1, zSql, SQLITE_UTF16NATIVE, SQLITE_STATIC);
  zSql8 = sqlite3ValueText(pVal, SQLITE_UTF8);
  if( zSql8 ){
    rc = sqlite3_complete(zSql8);
  }else{
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3ValueFree(pVal);
  return rc & 0xff;
}